

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InReadableOrder.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_109220c::ReadableOrderTraverser::visit
          (ReadableOrderTraverser *this,Block *block,ReachReason why,Block *header)

{
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  *this_00;
  Block *pBVar1;
  Id IVar2;
  size_type sVar3;
  Instruction *this_01;
  pointer ppBVar4;
  Block *block_local;
  Block *continueBlock;
  Block *mergeBlock;
  
  block_local = block;
  if (block != (Block *)0x0) {
    if (why == ReachViaControlFlow) {
      std::__detail::
      _Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->reachableViaControlFlow_,&block_local);
    }
    sVar3 = std::
            _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->visited_)._M_h,&block_local);
    if (sVar3 == 0) {
      this_00 = &this->delayed_;
      sVar3 = std::
              _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,&block_local);
      if (sVar3 == 0) {
        std::function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)>::operator()
                  (&this->callback_,block_local,why,header);
        std::__detail::
        _Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->visited_,&block_local);
        mergeBlock = (Block *)0x0;
        continueBlock = (Block *)0x0;
        this_01 = spv::Block::getMergeInstruction(block_local);
        if (this_01 != (Instruction *)0x0) {
          IVar2 = spv::Instruction::getIdOperand(this_01,0);
          mergeBlock = (block_local->parent->parent->idToInstruction).
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[IVar2]->block;
          std::__detail::
          _Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)this_00,&mergeBlock);
          if (this_01->opCode == OpLoopMerge) {
            IVar2 = spv::Instruction::getIdOperand(this_01,1);
            continueBlock =
                 (block_local->parent->parent->idToInstruction).
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[IVar2]->block;
            std::__detail::
            _Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)this_00,&continueBlock);
          }
        }
        pBVar1 = block_local;
        if (why == ReachViaControlFlow) {
          for (ppBVar4 = (block_local->successors).
                         super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              ppBVar4 !=
              (pBVar1->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppBVar4 = ppBVar4 + 1) {
            visit(this,*ppBVar4,ReachViaControlFlow,(Block *)0x0);
          }
        }
        if (continueBlock != (Block *)0x0) {
          sVar3 = std::
                  _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(this->reachableViaControlFlow_)._M_h,&continueBlock);
          std::
          _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&this_00->_M_h,&continueBlock);
          visit(this,continueBlock,(uint)(sVar3 == 0),block_local);
        }
        if (mergeBlock != (Block *)0x0) {
          sVar3 = std::
                  _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(this->reachableViaControlFlow_)._M_h,&mergeBlock);
          std::
          _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&this_00->_M_h,&mergeBlock);
          visit(this,mergeBlock,(uint)(sVar3 == 0) * 2,block_local);
        }
      }
    }
    return;
  }
  __assert_fail("block",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/InReadableOrder.cpp"
                ,0x49,
                "void (anonymous namespace)::ReadableOrderTraverser::visit(Block *, spv::ReachReason, Block *)"
               );
}

Assistant:

void visit(Block* block, spv::ReachReason why, Block* header)
    {
        assert(block);
        if (why == spv::ReachViaControlFlow) {
            reachableViaControlFlow_.insert(block);
        }
        if (visited_.count(block) || delayed_.count(block))
            return;
        callback_(block, why, header);
        visited_.insert(block);
        Block* mergeBlock = nullptr;
        Block* continueBlock = nullptr;
        auto mergeInst = block->getMergeInstruction();
        if (mergeInst) {
            Id mergeId = mergeInst->getIdOperand(0);
            mergeBlock = block->getParent().getParent().getInstruction(mergeId)->getBlock();
            delayed_.insert(mergeBlock);
            if (mergeInst->getOpCode() == spv::OpLoopMerge) {
                Id continueId = mergeInst->getIdOperand(1);
                continueBlock =
                    block->getParent().getParent().getInstruction(continueId)->getBlock();
                delayed_.insert(continueBlock);
            }
        }
        if (why == spv::ReachViaControlFlow) {
            const auto& successors = block->getSuccessors();
            for (auto it = successors.cbegin(); it != successors.cend(); ++it)
                visit(*it, why, nullptr);
        }
        if (continueBlock) {
            const spv::ReachReason continueWhy =
                (reachableViaControlFlow_.count(continueBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadContinue;
            delayed_.erase(continueBlock);
            visit(continueBlock, continueWhy, block);
        }
        if (mergeBlock) {
            const spv::ReachReason mergeWhy =
                (reachableViaControlFlow_.count(mergeBlock) > 0)
                    ? spv::ReachViaControlFlow
                    : spv::ReachDeadMerge;
            delayed_.erase(mergeBlock);
            visit(mergeBlock, mergeWhy, block);
        }
    }